

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

bool IsActorAnItem(AActor *mo)

{
  bool bVar1;
  uint uVar2;
  bool local_15;
  TFlags<ActorFlag,_unsigned_int> local_14;
  AActor *local_10;
  AActor *mo_local;
  
  local_10 = mo;
  bVar1 = DObject::IsKindOf((DObject *)mo,AInventory::RegistrationInfo.MyClass);
  local_15 = false;
  if (bVar1) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_14,
               (int)local_10 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
    local_15 = uVar2 != 0;
  }
  return local_15;
}

Assistant:

static bool IsActorAnItem(AActor *mo)
{
	return mo->IsKindOf(RUNTIME_CLASS(AInventory)) && mo->flags&MF_SPECIAL;
}